

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> * __thiscall
rcg::Interface::getDevices
          (vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
           *__return_storage_ptr__,Interface *this,uint64_t timeout)

{
  mutex *__mutex;
  _Atomic_word *p_Var1;
  int iVar2;
  PTLUpdateInterfaceList p_Var3;
  PTLOpenInterface p_Var4;
  int iVar5;
  uint uVar6;
  GC_ERROR GVar7;
  void *pvVar8;
  size_t sVar9;
  string *psVar10;
  Device *this_00;
  pointer psVar11;
  GenTLException *pGVar12;
  long *plVar13;
  pointer pwVar14;
  size_type *psVar15;
  uint32_t uVar16;
  mutex *pmVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  ulong uVar19;
  long lVar20;
  vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_> *this_01;
  bool bVar21;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> current;
  size_t size;
  uint32_t n;
  shared_ptr<rcg::Device> p;
  shared_ptr<const_rcg::GenTLWrapper> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Interface *local_1c8;
  void **local_1c0;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [8];
  
  __mutex = &this->mtx;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
    pmVar17 = __mutex;
LAB_0010eca2:
    pGVar12 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Interface::getDevices() (1) ","");
    std::operator+(&local_198,&local_178,&local_1c8->id);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_198);
    local_1e8._M_dataplus._M_p = (pointer)*plVar13;
    psVar15 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_1e8._M_dataplus._M_p == psVar15) {
      local_1e8.field_2._M_allocated_capacity = *psVar15;
      local_1e8.field_2._8_8_ = plVar13[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar15;
    }
    local_1e8._M_string_length = plVar13[1];
    *plVar13 = (long)psVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::to_string(&local_158,(int)pmVar17);
    std::operator+(local_138,&local_1e8,&local_158);
    GenTLException::GenTLException(pGVar12,local_138,local_1f0);
    __cxa_throw(pGVar12,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = this->ifh;
  if (pvVar8 != (void *)0x0) {
    local_1c0 = &this->ifh;
    local_1b8.
    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pwVar14 = (this->dlist).
              super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->dlist).
        super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pwVar14) {
      uVar19 = 0;
      do {
        p_Var18 = pwVar14[uVar19].super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        local_138[0]._M_string_length = (size_type)p_Var18;
        if (p_Var18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010e840:
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0010e842:
          local_138[0]._M_dataplus._M_p = (pointer)0x0;
LAB_0010e84e:
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010e853;
        }
        else {
          iVar5 = p_Var18->_M_use_count;
          do {
            if (iVar5 == 0) {
              local_138[0]._M_string_length = 0;
              goto LAB_0010e840;
            }
            LOCK();
            iVar2 = p_Var18->_M_use_count;
            bVar21 = iVar5 == iVar2;
            if (bVar21) {
              p_Var18->_M_use_count = iVar5 + 1;
              iVar2 = iVar5;
            }
            iVar5 = iVar2;
            UNLOCK();
          } while (!bVar21);
          if (p_Var18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010e840;
          if (p_Var18->_M_use_count == 0) goto LAB_0010e842;
          local_138[0]._M_dataplus._M_p =
               (pointer)pwVar14[uVar19].super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
          if ((element_type *)local_138[0]._M_dataplus._M_p != (element_type *)0x0) {
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            push_back(&local_1b8,(value_type *)local_138);
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length;
            goto LAB_0010e84e;
          }
LAB_0010e853:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        uVar19 = uVar19 + 1;
        pwVar14 = (this->dlist).
                  super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar19 < (ulong)((long)(this->dlist).
                                      super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pwVar14 >>
                               4));
      pvVar8 = *local_1c0;
    }
    uVar6 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->IFUpdateDeviceList)(pvVar8,(bool8_t *)0x0,timeout);
    local_1f0 = &this->gentl;
    local_1c8 = this;
    if (uVar6 == 0xfffffc12) {
      p_Var3 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               TLUpdateInterfaceList;
      pvVar8 = System::getHandle((this->parent).
                                 super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      GVar7 = (*p_Var3)(pvVar8,(bool8_t *)0x0,10);
      if (GVar7 != 0) {
        pGVar12 = (GenTLException *)__cxa_allocate_exception(0x28);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"Interface::getDevices() (recovery 1) ","");
        std::operator+(local_138,&local_1e8,&local_1c8->id);
        GenTLException::GenTLException(pGVar12,local_138,local_1f0);
        __cxa_throw(pGVar12,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      p_Var4 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               TLOpenInterface;
      pvVar8 = System::getHandle((this->parent).
                                 super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      GVar7 = (*p_Var4)(pvVar8,(this->id)._M_dataplus._M_p,local_1c0);
      if (GVar7 != 0) {
        pGVar12 = (GenTLException *)__cxa_allocate_exception(0x28);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"Interface::getDevices() (recovery 2) ","");
        std::operator+(local_138,&local_1e8,&local_1c8->id);
        GenTLException::GenTLException(pGVar12,local_138,local_1f0);
        __cxa_throw(pGVar12,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      uVar6 = (*((local_1f0->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->IFUpdateDeviceList)(*local_1c0,(bool8_t *)0x0,timeout);
    }
    pmVar17 = (mutex *)(ulong)uVar6;
    if (uVar6 != 0) goto LAB_0010eca2;
    local_158._M_dataplus._M_p._0_4_ = 0;
    GVar7 = (*((local_1f0->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->IFGetNumDevices)(*local_1c0,(uint32_t *)&local_158);
    if (GVar7 != 0) {
      pGVar12 = (GenTLException *)__cxa_allocate_exception(0x28);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Interface::getDevices() (2) ","");
      std::operator+(local_138,&local_1e8,&local_1c8->id);
      GenTLException::GenTLException(pGVar12,local_138,local_1f0);
      __cxa_throw(pGVar12,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    if ((uint)local_158._M_dataplus._M_p != 0) {
      uVar16 = 0;
      do {
        memset(local_138,0,0x100);
        local_178._M_dataplus._M_p = (pointer)0x100;
        GVar7 = (*((local_1f0->
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->IFGetDeviceID)(*local_1c0,uVar16,(char *)local_138,(size_t *)&local_178);
        if (GVar7 != 0) {
          pGVar12 = (GenTLException *)__cxa_allocate_exception(0x28);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,"Interface::getDevices() (3) ","");
          std::operator+(&local_1e8,&local_198,&local_1c8->id);
          GenTLException::GenTLException(pGVar12,&local_1e8,local_1f0);
          __cxa_throw(pGVar12,&GenTLException::typeinfo,GenTLException::~GenTLException);
        }
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        sVar9 = strlen((char *)local_138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,local_138,(long)&local_138[0]._M_dataplus._M_p + sVar9);
        uVar6 = 0xffffffff;
        if (local_1b8.
            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_1b8.
            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar20 = 0;
          uVar19 = 0;
          do {
            psVar10 = Device::getID_abi_cxx11_
                                (*(Device **)
                                  ((long)&((local_1b8.
                                            super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar20));
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar10->_M_string_length;
            if ((p_Var18 ==
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length) &&
               ((p_Var18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
                (iVar5 = bcmp((psVar10->_M_dataplus)._M_p,local_1e8._M_dataplus._M_p,(size_t)p_Var18
                             ), iVar5 == 0)))) {
              uVar6 = (uint)uVar19;
              break;
            }
            uVar19 = uVar19 + 1;
            lVar20 = lVar20 + 0x10;
            uVar6 = 0xffffffff;
          } while (uVar19 < (ulong)((long)local_1b8.
                                          super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1b8.
                                          super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if ((int)uVar6 < 0) {
          this_00 = (Device *)operator_new(0x130);
          std::__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<rcg::Interface,void>
                    ((__shared_ptr<rcg::Interface,(__gnu_cxx::_Lock_policy)2> *)&local_198,
                     (__weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> *)local_1c8);
          Device::Device(this_00,(shared_ptr<rcg::Interface> *)&local_198,local_1f0,
                         (char *)local_138);
          std::__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rcg::Device,void>
                    ((__shared_ptr<rcg::Device,(__gnu_cxx::_Lock_policy)2> *)&local_1e8,this_00);
          std::vector<std::shared_ptr<rcg::Device>,std::allocator<std::shared_ptr<rcg::Device>>>::
          emplace_back<std::shared_ptr<rcg::Device>>
                    ((vector<std::shared_ptr<rcg::Device>,std::allocator<std::shared_ptr<rcg::Device>>>
                      *)__return_storage_ptr__,(shared_ptr<rcg::Device> *)&local_1e8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length);
          }
        }
        else {
          std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
          ::push_back(__return_storage_ptr__,
                      local_1b8.
                      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar6);
        }
        uVar16 = uVar16 + 1;
        this = local_1c8;
      } while (uVar16 < (uint)local_158._M_dataplus._M_p);
    }
    this_01 = &this->dlist;
    std::vector<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>::
    _M_erase_at_end(this_01,(this_01->
                            super__Vector_base<std::weak_ptr<rcg::Device>,_std::allocator<std::weak_ptr<rcg::Device>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
    psVar11 = (__return_storage_ptr__->
              super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != psVar11) {
      lVar20 = 8;
      uVar19 = 0;
      do {
        local_138[0]._M_dataplus._M_p = *(pointer *)((long)psVar11 + lVar20 + -8);
        local_138[0]._M_string_length =
             *(long *)((long)&(psVar11->super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr + lVar20);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
            _M_weak_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
                 _M_weak_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
            _M_weak_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length)->
                 _M_weak_count + 1;
          }
        }
        std::vector<std::weak_ptr<rcg::Device>,std::allocator<std::weak_ptr<rcg::Device>>>::
        emplace_back<std::weak_ptr<rcg::Device>>
                  ((vector<std::weak_ptr<rcg::Device>,std::allocator<std::weak_ptr<rcg::Device>>> *)
                   this_01,(weak_ptr<rcg::Device> *)local_138);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_138[0]._M_string_length + 0xc);
            iVar5 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar5 = *(_Atomic_word *)(local_138[0]._M_string_length + 0xc);
            *(int *)(local_138[0]._M_string_length + 0xc) = iVar5 + -1;
          }
          if (iVar5 == 1) {
            (*(*(_func_int ***)local_138[0]._M_string_length)[3])();
          }
        }
        uVar19 = uVar19 + 1;
        psVar11 = (__return_storage_ptr__->
                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar20 = lVar20 + 0x10;
      } while (uVar19 < (ulong)((long)(__return_storage_ptr__->
                                      super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >>
                               4));
    }
    std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
    ~vector(&local_1b8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Device> > Interface::getDevices(uint64_t timeout)
{
  std::lock_guard<std::mutex> lock(mtx);

  std::vector<std::shared_ptr<Device> > ret;

  if (ifh != 0)
  {
    // get list of previously requested devices that are still in use

    std::vector<std::shared_ptr<Device> > current;

    for (size_t i=0; i<dlist.size(); i++)
    {
      std::shared_ptr<Device> p=dlist[i].lock();
      if (p)
      {
        current.push_back(p);
      }
    }

    // update available interfaces

    GenTL::GC_ERROR err=gentl->IFUpdateDeviceList(ifh, 0, timeout);

    if (err == GenTL::GC_ERR_INVALID_HANDLE)
    {
      // the interface handle is invalid, try to reopen the interface

      if (gentl->TLUpdateInterfaceList(parent->getHandle(), 0, 10) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (recovery 1) ")+id, gentl);
      }

      if (gentl->TLOpenInterface(parent->getHandle(), id.c_str(), &ifh) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (recovery 2) ")+id, gentl);
      }

      // try to repeat discovery of devices

      err=gentl->IFUpdateDeviceList(ifh, 0, timeout);
    }

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException(std::string("Interface::getDevices() (1) ")+id+" "+std::to_string(err), gentl);
    }

    // create list of devices, using either existing devices or
    // instantiating new ones

    uint32_t n=0;
    if (gentl->IFGetNumDevices(ifh, &n) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException(std::string("Interface::getDevices() (2) ")+id, gentl);
    }

    for (uint32_t i=0; i<n; i++)
    {
      char tmp[256]="";
      size_t size=sizeof(tmp);

      if (gentl->IFGetDeviceID(ifh, i, tmp, &size) != GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException(std::string("Interface::getDevices() (3) ")+id, gentl);
      }

      int k=find(current, tmp);

      if (k >= 0)
      {
        ret.push_back(current[static_cast<size_t>(k)]);
      }
      else
      {
        ret.push_back(std::shared_ptr<Device>(new Device(shared_from_this(), gentl, tmp)));
      }
    }

    // update internal list of devices for reusage on next call

    dlist.clear();
    for (size_t i=0; i<ret.size(); i++)
    {
      dlist.push_back(ret[i]);
    }
  }

  return ret;
}